

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O3

int reader(UI *ui,UI_STRING *uis)

{
  int iVar1;
  int iVar2;
  undefined8 *in_RDX;
  undefined8 uVar3;
  
  iVar1 = *(int *)uis;
  *(int *)uis = *(int *)uis + -1;
  uVar3 = 0x12;
  if (iVar1 == 0) {
    uVar3 = 0;
  }
  iVar2 = 0x119346;
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  *in_RDX = uVar3;
  return iVar2;
}

Assistant:

static const char *reader(lua_State *L, void *ud, size_t *size) {
    UNUSED(L);
    if ((*(int *) ud)--) {
        *size = sizeof(FUNCTION) - 1;
        return FUNCTION;
    } else {
        *size = 0;
        return NULL;
    }
}